

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

boundaries __thiscall
fmt::v6::detail::fp::assign_with_boundaries<long_double>(fp *this,longdouble d)

{
  undefined8 in_RDX;
  fp fVar1;
  boundaries bVar2;
  
  this->f = 0;
  this->e = 0;
  fVar1._8_8_ = in_RDX;
  fVar1.f = 0xffffffffffffffff;
  fVar1 = normalize<1>((detail *)0x1,fVar1);
  bVar2.upper = fVar1.f;
  bVar2.lower = -1L << (~(byte)fVar1.e & 0x3f);
  return bVar2;
}

Assistant:

boundaries assign_with_boundaries(Double d) {
    bool is_lower_closer = assign(d);
    fp lower =
        is_lower_closer ? fp((f << 2) - 1, e - 2) : fp((f << 1) - 1, e - 1);
    // 1 in normalize accounts for the exponent shift above.
    fp upper = normalize<1>(fp((f << 1) + 1, e - 1));
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }